

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall tf::SmallVectorImpl<tf::Node_*>::~SmallVectorImpl(SmallVectorImpl<tf::Node_*> *this)

{
  undefined1 *__ptr;
  
  __ptr = (undefined1 *)
          (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  if ((U *)__ptr ==
      &(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
       super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      std::free(this->begin());
  }